

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_15b07f::CFLTestWithData<unsigned_short>::randData
          (CFLTestWithData<unsigned_short> *this,offset_in_ACMRandom_to_subr random)

{
  undefined2 uVar1;
  long *plVar2;
  long in_RDX;
  code *in_RSI;
  long in_RDI;
  unsigned_short d;
  int i;
  int j;
  code *local_58;
  int local_30;
  int local_2c;
  
  for (local_2c = 0; local_2c < *(int *)(in_RDI + 0x10); local_2c = local_2c + 1) {
    for (local_30 = 0; local_30 < *(int *)(in_RDI + 0xc); local_30 = local_30 + 1) {
      plVar2 = (long *)(in_RDI + 0x14 + in_RDX);
      local_58 = in_RSI;
      if (((ulong)in_RSI & 1) != 0) {
        local_58 = *(code **)(in_RSI + *plVar2 + -1);
      }
      uVar1 = (*local_58)(plVar2);
      *(undefined2 *)(in_RDI + 0x18 + (long)(local_2c * 0x20 + local_30) * 2) = uVar1;
      *(undefined2 *)(in_RDI + 0x818 + (long)(local_2c * 0x20 + local_30) * 2) = uVar1;
    }
  }
  return;
}

Assistant:

void randData(I (ACMRandom::*random)()) {
    for (int j = 0; j < this->height; j++) {
      for (int i = 0; i < this->width; i++) {
        const I d = (this->rnd.*random)();
        data[j * CFL_BUF_LINE + i] = d;
        data_ref[j * CFL_BUF_LINE + i] = d;
      }
    }
  }